

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.c
# Opt level: O2

ch_context * ch_vm_newcontext(ch_program program)

{
  uint8_t *puVar1;
  ch_context *in_RDI;
  undefined4 in_stack_00000008;
  undefined4 in_stack_0000000c;
  undefined4 in_stack_00000010;
  undefined4 in_stack_00000014;
  undefined4 in_stack_00000018;
  undefined4 in_stack_0000001c;
  
  puVar1 = (uint8_t *)CONCAT44(in_stack_0000000c,in_stack_00000008);
  in_RDI->pstart = puVar1;
  in_RDI->pend = puVar1 + CONCAT44(in_stack_0000001c,in_stack_00000018);
  in_RDI->pcurrent =
       puVar1 + (ulong)(uint)program.start + CONCAT44(in_stack_00000014,in_stack_00000010);
  in_RDI->data_size = CONCAT44(in_stack_00000014,in_stack_00000010);
  ch_stack_create();
  memset(&in_RDI->call_stack,0,0x180c);
  in_RDI->open_upvalues = (ch_upvalue *)0x0;
  (in_RDI->globals).entries = (ch_table_entry *)0x0;
  (in_RDI->globals).capacity = 0;
  (in_RDI->globals).size = 0;
  (in_RDI->strings).entries = (ch_table_entry *)0x0;
  (in_RDI->strings).capacity = 0;
  (in_RDI->strings).size = 0;
  *(undefined4 *)&(in_RDI->program).start = in_stack_00000008;
  *(undefined4 *)((long)&(in_RDI->program).start + 4) = in_stack_0000000c;
  *(undefined4 *)&(in_RDI->program).data_size = in_stack_00000010;
  *(undefined4 *)((long)&(in_RDI->program).data_size + 4) = in_stack_00000014;
  *(undefined4 *)&(in_RDI->program).total_size = in_stack_00000018;
  *(undefined4 *)((long)&(in_RDI->program).total_size + 4) = in_stack_0000001c;
  (in_RDI->program).program_start_ptr = (uint)program.start;
  *(undefined4 *)&(in_RDI->program).field_0x1c = program.start._4_4_;
  (in_RDI->program_return_value).type = PRIMITIVE_NULL;
  (in_RDI->program_return_value).field_1.number_value = 0.0;
  ch_table_create(&in_RDI->globals);
  ch_table_create(&in_RDI->strings);
  return in_RDI;
}

Assistant:

ch_context ch_vm_newcontext(ch_program program) {
  ch_context context = {
      .pstart = program.start,
      .pend = program.start + program.total_size,
      // Seek after the data section
      .pcurrent = program.start + program.data_size + program.program_start_ptr,
      .data_size = program.data_size,
      .stack = ch_stack_create(),
      .call_stack =
          (ch_call_stack){
              .size = 0,
          },
      .exit = RUNNING,
      .program = program,
      .program_return_value = MAKE_NULL(),
      .open_upvalues=NULL
  };

  ch_table_create(&context.globals);
  ch_table_create(&context.strings);

  return context;
}